

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_lax_polygon_layer.cc
# Opt level: O0

void __thiscall
s2builderutil::LaxPolygonLayer::Init
          (LaxPolygonLayer *this,S2LaxPolygonShape *polygon,LabelSetIds *label_set_ids,
          IdSetLexicon *label_set_lexicon,Options *options)

{
  ostream *poVar1;
  S2LogMessage local_48;
  S2LogMessageVoidify local_31;
  Options *local_30;
  Options *options_local;
  IdSetLexicon *label_set_lexicon_local;
  LabelSetIds *label_set_ids_local;
  S2LaxPolygonShape *polygon_local;
  LaxPolygonLayer *this_local;
  
  if ((label_set_ids == (LabelSetIds *)0x0) == (label_set_lexicon == (IdSetLexicon *)0x0)) {
    this->polygon_ = polygon;
    this->label_set_ids_ = label_set_ids;
    this->label_set_lexicon_ = label_set_lexicon;
    this->options_ = *options;
    return;
  }
  local_30 = options;
  options_local = (Options *)label_set_lexicon;
  label_set_lexicon_local = (IdSetLexicon *)label_set_ids;
  label_set_ids_local = (LabelSetIds *)polygon;
  polygon_local = (S2LaxPolygonShape *)this;
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_lax_polygon_layer.cc"
             ,0x3c,kFatal,(ostream *)&std::cerr);
  poVar1 = S2LogMessage::stream(&local_48);
  poVar1 = std::operator<<(poVar1,
                           "Check failed: (label_set_ids == nullptr) == (label_set_lexicon == nullptr) "
                          );
  S2LogMessageVoidify::operator&(&local_31,poVar1);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_48);
}

Assistant:

void LaxPolygonLayer::Init(
    S2LaxPolygonShape* polygon, LabelSetIds* label_set_ids,
    IdSetLexicon* label_set_lexicon, const Options& options) {
  S2_DCHECK_EQ(label_set_ids == nullptr, label_set_lexicon == nullptr);
  polygon_ = polygon;
  label_set_ids_ = label_set_ids;
  label_set_lexicon_ = label_set_lexicon;
  options_ = options;
}